

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O1

WebPInfoStatus ParseLosslessHeader(ChunkData *chunk_data,WebPInfo *webp_info)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  WebPInfoStatus WVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong data_size;
  uint8_t *puVar12;
  uint64_t local_38;
  
  sVar1 = chunk_data->size;
  puVar12 = chunk_data->payload;
  local_38 = 0;
  puts("  Parsing lossless bitstream...");
  if (sVar1 - 8 < 5) {
    WVar4 = WEBP_INFO_TRUNCATED_DATA;
    if (webp_info->show_diagnosis != 0) {
      ParseLosslessHeader_cold_6();
    }
  }
  else if (*puVar12 == '/') {
    puVar12 = puVar12 + 1;
    data_size = sVar1 - 9;
    uVar7 = 0;
    uVar10 = 0;
    do {
      uVar6 = uVar10;
      if (0xd < uVar6) break;
      uVar5 = local_38 >> 3;
      uVar10 = uVar6;
      if (uVar5 < data_size) {
        uVar7 = uVar7 | (uint)((puVar12[uVar5] >> ((uint)local_38 & 7) & 1) != 0) <<
                        ((byte)uVar6 & 0x1f);
        uVar10 = uVar6 + 1;
      }
      local_38 = local_38 + 1;
    } while (uVar5 < data_size);
    if (uVar6 < 0xe) {
      WVar4 = WEBP_INFO_TRUNCATED_DATA;
      if (webp_info->show_diagnosis != 0) {
        ParseLosslessHeader_cold_5();
      }
    }
    else {
      uVar6 = 0;
      uVar10 = 0;
      do {
        uVar9 = uVar10;
        if (0xd < uVar9) break;
        uVar5 = local_38 >> 3;
        uVar10 = uVar9;
        if (uVar5 < data_size) {
          uVar6 = uVar6 | (uint)((puVar12[uVar5] >> ((uint)local_38 & 7) & 1) != 0) <<
                          ((byte)uVar9 & 0x1f);
          uVar10 = uVar9 + 1;
        }
        local_38 = local_38 + 1;
      } while (uVar5 < data_size);
      if (uVar9 < 0xe) {
        WVar4 = WEBP_INFO_TRUNCATED_DATA;
        if (webp_info->show_diagnosis != 0) {
          ParseLosslessHeader_cold_4();
        }
      }
      else {
        uVar10 = 0;
        bVar3 = false;
        do {
          bVar2 = bVar3;
          if (bVar2) break;
          uVar5 = local_38 >> 3;
          bVar3 = bVar2;
          if (uVar5 < data_size) {
            uVar10 = uVar10 | (puVar12[uVar5] >> ((uint)local_38 & 7) & 1) != 0;
            bVar3 = true;
          }
          local_38 = local_38 + 1;
        } while (uVar5 < data_size);
        if (bVar2) {
          uVar11 = 0;
          uVar9 = 0;
          do {
            uVar8 = uVar9;
            if (2 < uVar8) break;
            uVar5 = local_38 >> 3;
            uVar9 = uVar8;
            if (uVar5 < data_size) {
              uVar11 = uVar11 | (uint)((puVar12[uVar5] >> ((uint)local_38 & 7) & 1) != 0) <<
                                ((byte)uVar8 & 0x1f);
              uVar9 = uVar8 + 1;
            }
            local_38 = local_38 + 1;
          } while (uVar5 < data_size);
          if (uVar8 < 3) {
            WVar4 = WEBP_INFO_TRUNCATED_DATA;
            if (webp_info->show_diagnosis != 0) {
              ParseLosslessHeader_cold_2();
            }
          }
          else {
            printf("  Width:            %d\n",(ulong)(uVar7 + 1));
            printf("  Height:           %d\n",(ulong)(uVar6 + 1));
            printf("  Alpha:            %d\n",(ulong)uVar10);
            printf("  Version:          %d\n",(ulong)uVar11);
            WVar4 = ParseLosslessTransform(webp_info,puVar12,data_size,&local_38);
          }
        }
        else {
          WVar4 = WEBP_INFO_TRUNCATED_DATA;
          if (webp_info->show_diagnosis != 0) {
            ParseLosslessHeader_cold_3();
          }
        }
      }
    }
  }
  else {
    WVar4 = WEBP_INFO_BITSTREAM_ERROR;
    if (webp_info->show_diagnosis != 0) {
      ParseLosslessHeader_cold_1();
    }
  }
  return WVar4;
}

Assistant:

static WebPInfoStatus ParseLosslessHeader(const ChunkData* const chunk_data,
                                          WebPInfo* const webp_info) {
  const uint8_t* data = chunk_data->payload;
  size_t data_size = chunk_data->size - CHUNK_HEADER_SIZE;
  uint64_t bit_position = 0;
  uint64_t* const bit_pos = &bit_position;
  WebPInfoStatus status;
  printf("  Parsing lossless bitstream...\n");
  if (data_size < VP8L_FRAME_HEADER_SIZE) {
    LOG_ERROR("Truncated lossless bitstream.");
    return WEBP_INFO_TRUNCATED_DATA;
  }
  if (data[0] != VP8L_MAGIC_BYTE) {
    LOG_ERROR("Invalid lossless bitstream signature.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  data += 1;
  data_size -= 1;
  {
    int width, height, has_alpha, version;
    LL_GET_BITS(width, 14);
    LL_GET_BITS(height, 14);
    LL_GET_BITS(has_alpha, 1);
    LL_GET_BITS(version, 3);
    width += 1;
    height += 1;
    printf("  Width:            %d\n", width);
    printf("  Height:           %d\n", height);
    printf("  Alpha:            %d\n", has_alpha);
    printf("  Version:          %d\n", version);
  }
  status = ParseLosslessTransform(webp_info, data, data_size, bit_pos);
  if (status != WEBP_INFO_OK) return status;
  return WEBP_INFO_OK;
}